

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O3

void __thiscall vec<bool>::growTo(vec<bool> *this,uint size)

{
  uint uVar1;
  
  if (this->sz < size) {
    reserve(this,size);
    uVar1 = this->sz;
    if (uVar1 < size) {
      memset(this->data + uVar1,0,(ulong)(~uVar1 + size) + 1);
    }
    this->sz = size;
  }
  return;
}

Assistant:

void growTo(unsigned int size) {
		if (size <= sz) {
			return;
		}
		reserve(size);
		for (unsigned int i = sz; i < size; i++) {
			new (&data[i]) T();
		}
		sz = size;
	}